

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcUtil.c
# Opt level: O1

Lpk_Fun_t * Lpk_FunDup(Lpk_Fun_t *p,uint *pTruth)

{
  Vec_Ptr_t *pVVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint uVar9;
  Lpk_Fun_t *__s;
  void **ppvVar10;
  byte bVar11;
  ulong uVar12;
  uint nVars;
  int iVar13;
  
  uVar9 = *(uint *)&p->field_0x8;
  nVars = uVar9 >> 7 & 0x1f;
  bVar11 = (char)nVars - 5;
  if (nVars < 6) {
    bVar11 = 0;
  }
  __s = (Lpk_Fun_t *)malloc((0xcL << (bVar11 & 0x3f)) + 0xe8);
  memset(__s,0,0xe8);
  iVar13 = p->vNodes->nSize;
  __s->vNodes = p->vNodes;
  *(uint *)&__s->field_0x8 =
       uVar9 & 0x3fffff80 | *(uint *)&__s->field_0x8 & 0xc0000000 | (byte)iVar13 & 0xc000007f;
  __s->nDelayLim = p->nDelayLim;
  uVar9 = Kit_TruthSupport(pTruth,nVars);
  __s->uSupp = uVar9;
  uVar9 = *(uint *)&p->field_0x8 >> 7 & 0x1f;
  uVar12 = (ulong)(uint)(1 << ((char)uVar9 - 5U & 0x1f));
  if (uVar9 < 6) {
    uVar12 = 1;
  }
  memcpy(&__s->field_0xe4,pTruth,uVar12 << 2);
  uVar2 = *(undefined8 *)(p->pFanins + 8);
  *(undefined8 *)__s->pFanins = *(undefined8 *)p->pFanins;
  *(undefined8 *)(__s->pFanins + 8) = uVar2;
  uVar2 = *(undefined8 *)p->pDelays;
  uVar3 = *(undefined8 *)(p->pDelays + 2);
  uVar4 = *(undefined8 *)(p->pDelays + 4);
  uVar5 = *(undefined8 *)(p->pDelays + 6);
  uVar6 = *(undefined8 *)(p->pDelays + 8);
  uVar7 = *(undefined8 *)(p->pDelays + 10);
  uVar8 = *(undefined8 *)(p->pDelays + 0xe);
  *(undefined8 *)(__s->pDelays + 0xc) = *(undefined8 *)(p->pDelays + 0xc);
  *(undefined8 *)(__s->pDelays + 0xe) = uVar8;
  *(undefined8 *)(__s->pDelays + 8) = uVar6;
  *(undefined8 *)(__s->pDelays + 10) = uVar7;
  *(undefined8 *)(__s->pDelays + 4) = uVar4;
  *(undefined8 *)(__s->pDelays + 6) = uVar5;
  *(undefined8 *)__s->pDelays = uVar2;
  *(undefined8 *)(__s->pDelays + 2) = uVar3;
  pVVar1 = p->vNodes;
  uVar9 = pVVar1->nCap;
  if (pVVar1->nSize == uVar9) {
    if ((int)uVar9 < 0x10) {
      if (pVVar1->pArray == (void **)0x0) {
        ppvVar10 = (void **)malloc(0x80);
      }
      else {
        ppvVar10 = (void **)realloc(pVVar1->pArray,0x80);
      }
      pVVar1->pArray = ppvVar10;
      iVar13 = 0x10;
    }
    else {
      iVar13 = uVar9 * 2;
      if (iVar13 <= (int)uVar9) goto LAB_004e38f4;
      if (pVVar1->pArray == (void **)0x0) {
        ppvVar10 = (void **)malloc((ulong)uVar9 << 4);
      }
      else {
        ppvVar10 = (void **)realloc(pVVar1->pArray,(ulong)uVar9 << 4);
      }
      pVVar1->pArray = ppvVar10;
    }
    pVVar1->nCap = iVar13;
  }
LAB_004e38f4:
  iVar13 = pVVar1->nSize;
  pVVar1->nSize = iVar13 + 1;
  pVVar1->pArray[iVar13] = __s;
  return __s;
}

Assistant:

Lpk_Fun_t * Lpk_FunDup( Lpk_Fun_t * p, unsigned * pTruth )
{
    Lpk_Fun_t * pNew;
    pNew = Lpk_FunAlloc( p->nVars );
    pNew->Id = Vec_PtrSize(p->vNodes);
    pNew->vNodes = p->vNodes;
    pNew->nVars = p->nVars;
    pNew->nLutK = p->nLutK;
    pNew->nAreaLim = p->nAreaLim;
    pNew->nDelayLim = p->nDelayLim;
    pNew->uSupp = Kit_TruthSupport( pTruth, p->nVars );
    Kit_TruthCopy( Lpk_FunTruth(pNew,0), pTruth, p->nVars );
    memcpy( pNew->pFanins, p->pFanins, 16 );
    memcpy( pNew->pDelays, p->pDelays, sizeof(int)*16 );
    Vec_PtrPush( p->vNodes, pNew );
    return pNew;
}